

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

uint computesizes(Counters *ct)

{
  bool bVar1;
  uint local_24;
  uint nums;
  uint optimal;
  uint na;
  uint a;
  uint twotoi;
  int i;
  Counters *ct_local;
  
  optimal = 0;
  nums = 0;
  local_24 = 0;
  a = 0;
  na = 1;
  while( true ) {
    bVar1 = false;
    if (na != 0) {
      bVar1 = (ulong)na <= (ulong)ct->na * 3;
    }
    if (!bVar1) break;
    optimal = ct->nums[(int)a] + optimal;
    if ((ct->nums[(int)a] != 0) && ((ulong)na <= (ulong)optimal * 3)) {
      local_24 = na;
      nums = optimal;
    }
    a = a + 1;
    na = na << 1;
  }
  ct->na = nums;
  return local_24;
}

Assistant:

static unsigned computesizes (Counters *ct) {
  int i;
  unsigned int twotoi;  /* 2^i (candidate for optimal size) */
  unsigned int a = 0;  /* number of elements smaller than 2^i */
  unsigned int na = 0;  /* number of elements to go to array part */
  unsigned int optimal = 0;  /* optimal size for array part */
  /* traverse slices while 'twotoi' does not overflow and total of array
     indices still can satisfy 'arrayXhash' against the array size */
  for (i = 0, twotoi = 1;
       twotoi > 0 && arrayXhash(twotoi, ct->na);
       i++, twotoi *= 2) {
    unsigned nums = ct->nums[i];
    a += nums;
    if (nums > 0 &&  /* grows array only if it gets more elements... */
        arrayXhash(twotoi, a)) {  /* ...while using "less memory" */
      optimal = twotoi;  /* optimal size (till now) */
      na = a;  /* all elements up to 'optimal' will go to array part */
    }
  }
  ct->na = na;
  return optimal;
}